

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>_>
                  *eval,scalar_sum_op<float,_float> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>
                 *xpr)

{
  Index IVar1;
  Index index_00;
  long lVar2;
  long index_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  float afVar3 [4];
  CoeffReturnType local_f4;
  long local_f0;
  Index index_3;
  long local_e0;
  Index index_2;
  long local_d0;
  Index index_1;
  float local_b8 [4];
  float local_a8 [4];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  int packetAlignment;
  Index packetSize;
  Index size;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>
  *xpr_local;
  scalar_sum_op<float,_float> *func_local;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>_>
  *eval_local;
  
  IVar1 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true>_>_>
          ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>_>
                  *)xpr);
  index_00 = first_default_aligned<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>>
                       ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>_>
                         *)xpr);
  lVar2 = ((IVar1 - index_00) / 4) * 4;
  index_01 = index_00 + ((IVar1 - index_00) / 8) * 8;
  if (lVar2 == 0) {
    packet_res0[3] =
         binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
         ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                  *)eval,0);
    for (local_f0 = 1; local_f0 < IVar1; local_f0 = local_f0 + 1) {
      local_f4 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                 ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                          *)eval,local_f0);
      packet_res0[3] = scalar_sum_op<float,_float>::operator()(func,packet_res0 + 3,&local_f4);
    }
  }
  else {
    afVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
             ::packet<0,float__vector(4)>
                       ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                         *)eval,index_00);
    unique0x100000b3 = extraout_XMM0_Dc;
    packet_res1._8_8_ = afVar3._0_8_;
    unique0x100000b7 = extraout_XMM0_Dd;
    if (4 < lVar2) {
      afVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
               ::packet<0,float__vector(4)>
                         ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                           *)eval,index_00 + 4);
      unique0x100000d7 = (float)extraout_XMM0_Dc_00;
      index._0_4_ = (float)(int)afVar3._0_8_;
      index._4_4_ = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
      unique0x100000db = extraout_XMM0_Dd_00;
      local_90 = index_00;
      while (local_90 = local_90 + 8, local_90 < index_01) {
        afVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                 ::packet<0,float__vector(4)>
                           ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                             *)eval,local_90);
        local_a8[2] = (float)extraout_XMM0_Dc_01;
        local_a8[0] = (float)(int)afVar3._0_8_;
        local_a8[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        local_a8[3] = extraout_XMM0_Dd_01;
        afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                           ((scalar_sum_op<float,float> *)func,(float (*) [4])(packet_res1 + 2),
                            &local_a8);
        unique0x1000011f = extraout_XMM0_Dc_02;
        packet_res1._8_8_ = afVar3._0_8_;
        unique0x10000123 = extraout_XMM0_Dd_02;
        afVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                 ::packet<0,float__vector(4)>
                           ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                             *)eval,local_90 + 4);
        local_b8[2] = (float)extraout_XMM0_Dc_03;
        local_b8[0] = (float)(int)afVar3._0_8_;
        local_b8[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        local_b8[3] = extraout_XMM0_Dd_03;
        afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                           ((scalar_sum_op<float,float> *)func,(float (*) [4])&index,&local_b8);
        unique0x10000167 = (float)extraout_XMM0_Dc_04;
        index._0_4_ = (float)(int)afVar3._0_8_;
        index._4_4_ = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        unique0x1000016b = extraout_XMM0_Dd_04;
      }
      afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                         ((scalar_sum_op<float,float> *)func,(float (*) [4])(packet_res1 + 2),
                          (float (*) [4])&index);
      unique0x1000018b = extraout_XMM0_Dc_05;
      packet_res1._8_8_ = afVar3._0_8_;
      unique0x1000018f = extraout_XMM0_Dd_05;
      if (index_01 < index_00 + lVar2) {
        afVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                 ::packet<0,float__vector(4)>
                           ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                             *)eval,index_01);
        unique0x100001af = (float)extraout_XMM0_Dc_06;
        index_1._0_4_ = (float)(int)afVar3._0_8_;
        index_1._4_4_ = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        unique0x100001b3 = extraout_XMM0_Dd_06;
        afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                           ((scalar_sum_op<float,float> *)func,(float (*) [4])(packet_res1 + 2),
                            (float (*) [4])&index_1);
        unique0x100001d3 = extraout_XMM0_Dc_07;
        packet_res1._8_8_ = afVar3._0_8_;
        unique0x100001d7 = extraout_XMM0_Dd_07;
      }
    }
    packet_res0[3] =
         scalar_sum_op<float,float>::predux<float__vector(4)>
                   ((scalar_sum_op<float,float> *)func,(float (*) [4])(packet_res1 + 2));
    for (local_d0 = 0; local_e0 = index_00 + lVar2, local_d0 < index_00; local_d0 = local_d0 + 1) {
      index_2._4_4_ =
           binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
           ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                    *)eval,local_d0);
      packet_res0[3] =
           scalar_sum_op<float,_float>::operator()
                     (func,packet_res0 + 3,(float *)((long)&index_2 + 4));
    }
    for (; local_e0 < IVar1; local_e0 = local_e0 + 1) {
      index_3._4_4_ =
           binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
           ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                    *)eval,local_e0);
      packet_res0[3] =
           scalar_sum_op<float,_float>::operator()
                     (func,packet_res0 + 3,(float *)((long)&index_3 + 4));
    }
  }
  return packet_res0[3];
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }